

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tarray.h
# Opt level: O3

void __thiscall
TMap<FName,_DamageTypeDefinition,_THashTraits<FName>,_TValueTraits<DamageTypeDefinition>_>::Resize
          (TMap<FName,_DamageTypeDefinition,_THashTraits<FName>,_TValueTraits<DamageTypeDefinition>_>
           *this,hash_t nhsize)

{
  double *pdVar1;
  uint uVar2;
  Node *block;
  double dVar3;
  undefined8 in_RAX;
  Node *pNVar4;
  long lVar5;
  undefined8 uStack_38;
  
  uVar2 = this->Size;
  block = this->Nodes;
  uStack_38 = in_RAX;
  SetNodeVector(this,nhsize);
  this->NumUsed = 0;
  if ((ulong)uVar2 != 0) {
    lVar5 = 0;
    do {
      if (*(long *)((long)&block->Next + lVar5) != 1) {
        uStack_38 = CONCAT44(*(undefined4 *)((long)&(block->Pair).Key.Index + lVar5),
                             (undefined4)uStack_38);
        pNVar4 = NewKey(this,(FName *)((long)&uStack_38 + 4));
        pdVar1 = (double *)((long)&(block->Pair).Value.DefaultFactor + lVar5);
        dVar3 = pdVar1[1];
        (pNVar4->Pair).Value.DefaultFactor = *pdVar1;
        *(double *)&(pNVar4->Pair).Value.ReplaceFactor = dVar3;
      }
      lVar5 = lVar5 + 0x20;
    } while ((ulong)uVar2 << 5 != lVar5);
  }
  M_Free(block);
  return;
}

Assistant:

void Resize(hash_t nhsize)
	{
		hash_t i, oldhsize = Size;
		Node *nold = Nodes;
		/* create new hash part with appropriate size */
		SetNodeVector(nhsize);
		/* re-insert elements from hash part */
		NumUsed = 0;
		for (i = 0; i < oldhsize; ++i)
		{
			if (!nold[i].IsNil())
			{
				Node *n = NewKey(nold[i].Pair.Key);
				::new(&n->Pair.Value) VT(nold[i].Pair.Value);
				nold[i].~Node();
			}
		}
		M_Free(nold);
	}